

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH32_resetState(void *state_in,U32 seed)

{
  XXH_state32_t *state;
  U32 seed_local;
  void *state_in_local;
  
  *(U32 *)((long)state_in + 8) = seed;
  *(U32 *)((long)state_in + 0xc) = seed + 0x24234428;
  *(U32 *)((long)state_in + 0x10) = seed + 0x85ebca77;
  *(U32 *)((long)state_in + 0x14) = seed;
  *(U32 *)((long)state_in + 0x18) = seed + 0x61c8864f;
  *(undefined8 *)state_in = 0;
  *(undefined4 *)((long)state_in + 0x1c) = 0;
  return XXH_OK;
}

Assistant:

XXH_errorcode XXH32_resetState(void* state_in, U32 seed)
{ 
    struct XXH_state32_t * state = (struct XXH_state32_t *) state_in;
    state->seed = seed;
    state->v1 = seed + PRIME32_1 + PRIME32_2;
    state->v2 = seed + PRIME32_2;
    state->v3 = seed + 0;
    state->v4 = seed - PRIME32_1;
    state->total_len = 0;
    state->memsize = 0;
    return XXH_OK;
}